

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_for.hpp
# Opt level: O0

void Omega_h::parallel_for<Omega_h::elements_across_sides_count_functor>
               (LO n,elements_across_sides_count_functor *f)

{
  char *file;
  IntIterator last;
  IntIterator first;
  allocator local_99;
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [39];
  ScopedTimer local_31;
  elements_across_sides_count_functor *peStack_30;
  ScopedTimer omega_h_scoped_function_timer;
  elements_across_sides_count_functor *f_local;
  LO n_local;
  
  peStack_30 = f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
             ,&local_99);
  std::operator+(local_78,(char *)local_98);
  std::__cxx11::to_string((__cxx11 *)&last,0x54);
  std::operator+(local_58,local_78);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_31,"parallel_for",file);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)&last);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  for_each<Omega_h::IntIterator,Omega_h::elements_across_sides_count_functor&>
            ((IntIterator)0x0,(IntIterator)n,peStack_30);
  ScopedTimer::~ScopedTimer(&local_31);
  return;
}

Assistant:

void parallel_for(LO n, UnaryFunction&& f) {
  OMEGA_H_TIME_FUNCTION;
  auto const first = IntIterator(0);
  auto const last = IntIterator(n);
  ::Omega_h::for_each(first, last, f);
}